

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Token * __thiscall
EOPlus::Parser_Token_Server_Base::GetToken
          (Token *__return_storage_ptr__,Parser_Token_Server_Base *this,uint allow)

{
  bool bVar1;
  reference pvVar2;
  variant local_1a0;
  Token local_160;
  Token local_110;
  var_type local_c0;
  int newlines;
  variant local_b0;
  undefined1 local_70 [8];
  Token t;
  uint allow_local;
  Parser_Token_Server_Base *this_local;
  
  t._76_4_ = allow;
  util::variant::variant(&local_b0);
  Token::Token((Token *)local_70,Invalid,&local_b0);
  util::variant::~variant(&local_b0);
  local_c0 = type_int;
  while( true ) {
    bVar1 = std::stack<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::
            empty(&this->token_buffer);
    if (bVar1) {
      (**this->_vptr_Parser_Token_Server_Base)(&local_110);
      Token::operator=((Token *)local_70,&local_110);
      Token::~Token(&local_110);
    }
    else {
      pvVar2 = std::stack<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>
               ::top(&this->token_buffer);
      Token::operator=((Token *)local_70,pvVar2);
      std::stack<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::pop
                (&this->token_buffer);
    }
    if ((local_70._0_4_ != NewLine) || (this->line = this->line + 1, (t._76_4_ & 0x80) == 0x80))
    break;
    local_c0 = local_c0 + type_float;
  }
  t.data.type = local_c0;
  if ((local_70._0_4_ & t._76_4_) == local_70._0_4_) {
    Token::Token(__return_storage_ptr__,(Token *)local_70);
  }
  else {
    Token::Token(&local_160,(Token *)local_70);
    PutBack(this,&local_160);
    Token::~Token(&local_160);
    util::variant::variant(&local_1a0);
    Token::Token(__return_storage_ptr__,Invalid,&local_1a0);
    util::variant::~variant(&local_1a0);
  }
  Token::~Token((Token *)local_70);
  return __return_storage_ptr__;
}

Assistant:

Token Parser_Token_Server_Base::GetToken(unsigned int allow)
	{
		Token t;
		int newlines = 0;

		while (true)
		{
			if (!this->token_buffer.empty())
			{
				t = this->token_buffer.top();
				this->token_buffer.pop();
			}
			else
			{
				t = this->xGetToken();
			}

			if (t.type == Token::NewLine)
			{
				++this->line;

				if ((Token::NewLine & allow) == Token::NewLine)
					break;

				++newlines;
			}
			else
			{
				break;
			}
		}

		t.newlines = newlines;

		if ((t.type & allow) != t.type)
		{
			this->PutBack(t);
			return Token();
		}

		return t;
	}